

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

TokenMapEntry * __thiscall
TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
          (TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_> *this,
          short key,TokenMapEntry *value)

{
  Node *local_28;
  Node *n;
  TokenMapEntry *value_local;
  short key_local;
  TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_> *this_local;
  
  local_28 = FindKey(this,key);
  if (local_28 == (Node *)0x0) {
    local_28 = NewKey(this,key);
    (local_28->Pair).Value = *value;
  }
  else {
    (local_28->Pair).Value = *value;
  }
  return &(local_28->Pair).Value;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}